

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O0

void __thiscall Gameplay::economyPhase(Gameplay *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pPVar3;
  Stronghold *this_00;
  string *psVar4;
  DynastyDeck *this_01;
  _Self local_20;
  _List_node_base *local_18;
  Gameplay *local_10;
  Gameplay *this_local;
  
  local_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"ECONOMY PHASE");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ArrangeTurns(this);
  local_18 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_20);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Player ");
    pPVar3 = std::_List_iterator<Player>::operator->(&this->it);
    this_00 = Player::getStronghold(pPVar3);
    psVar4 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pPVar3 = std::_List_iterator<Player>::operator->(&this->it);
    this_01 = Player::getProvinces(pPVar3);
    DynastyDeck::PrintCards(this_01);
    pPVar3 = std::_List_iterator<Player>::operator->(&this->it);
    Player::buyCards(pPVar3);
    std::_List_iterator<Player>::operator++(&this->it,0);
  }
  return;
}

Assistant:

void Gameplay::economyPhase()                                   //phase4: each player can buy black cards if he wants
{
    cout << "ECONOMY PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << it->getStronghold()->getName() << endl << endl;

        it->getProvinces().PrintCards();
        it->buyCards();
    }
}